

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_logger.cpp
# Opt level: O3

void juzzlin::SimpleLogger::initialize(string *filename,bool append)

{
  pointer pcVar1;
  string local_38;
  
  pcVar1 = (filename->_M_dataplus)._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + filename->_M_string_length);
  Impl::initialize(&local_38,append);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void SimpleLogger::initialize(std::string filename, bool append)
{
    Impl::initialize(filename, append);
}